

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

ostream * operator<<(ostream *out,DataSet *dataset)

{
  ostream *poVar1;
  ulong uVar2;
  uint row;
  uint col;
  Matrix<double> *this;
  double dVar3;
  char local_43 [3];
  Shape local_40;
  
  local_40.n_row = (dataset->m_matrix).m_shape.n_row;
  local_40.n_col = (dataset->m_matrix).m_shape.n_col;
  local_40.is_diogonal = (dataset->m_matrix).m_shape.is_diogonal;
  poVar1 = operator<<(out,&local_40);
  local_43[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_43 + 2,1);
  uVar2._0_4_ = (dataset->m_matrix).m_shape.n_row;
  uVar2._4_4_ = (dataset->m_matrix).m_shape.n_col;
  if ((undefined4)uVar2 != 0) {
    this = &dataset->m_matrix;
    row = 0;
    do {
      if (uVar2 >> 0x20 != 0) {
        col = 0;
        do {
          dVar3 = Matrix<double>::get(this,row,col);
          poVar1 = std::ostream::_M_insert<double>(dVar3);
          local_43[1] = 9;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_43 + 1,1);
          col = col + 1;
        } while (col < (dataset->m_matrix).m_shape.n_col);
      }
      local_43[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(out,local_43,1);
      row = row + 1;
      uVar2._0_4_ = (this->m_shape).n_row;
      uVar2._4_4_ = (this->m_shape).n_col;
    } while (row < (uint)(undefined4)uVar2);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const DataSet& dataset){
    out<<dataset.shape()<<'\n';
    for(unsigned i=0;i<dataset.m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<dataset.m_matrix.shape().n_col;++j){
            out<<dataset.m_matrix.get(i,j)<<'\t';
        }   out<<'\n';
    }
    return out;
}